

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OdiPublisher.cpp
# Opt level: O3

bool OdiPublisher::CopyFile(char *source_file_name,char *dest_file_name)

{
  int iVar1;
  FILE *__stream;
  FILE *__s;
  size_t sVar2;
  uint *puVar3;
  bool bVar4;
  char line [512];
  undefined1 auStack_228 [520];
  
  __stream = (FILE *)ithi_file_open(source_file_name,"r");
  if (__stream == (FILE *)0x0) {
    puVar3 = (uint *)__errno_location();
    bVar4 = false;
    printf("Could not read file %s, err: %d\n",source_file_name,(ulong)*puVar3);
  }
  else {
    __s = (FILE *)ithi_file_open(dest_file_name,"w");
    if (__s == (FILE *)0x0) {
      puVar3 = (uint *)__errno_location();
      bVar4 = false;
      printf("Could not write file %s, err: %d\n",dest_file_name,(ulong)*puVar3);
      __s = __stream;
    }
    else {
      do {
        sVar2 = fread(auStack_228,1,0x200,__stream);
        if (sVar2 == 0) {
          iVar1 = feof(__stream);
          bVar4 = iVar1 != 0;
          goto LAB_001a57b2;
        }
        sVar2 = fwrite(auStack_228,1,sVar2,__s);
      } while (sVar2 != 0);
      bVar4 = false;
LAB_001a57b2:
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
    }
    fclose(__s);
  }
  return bVar4;
}

Assistant:

bool OdiPublisher::CopyFile(const char * source_file_name, const char * dest_file_name)
{
    bool ret = true;
    char line[512];
    FILE * F_out = NULL;
    FILE* F_in = ithi_file_open(source_file_name, "r");

    if (F_in != NULL)
    {
        F_out = ithi_file_open(dest_file_name, "w");
        if (F_out == NULL) {
            printf("Could not write file %s, err: %d\n", dest_file_name, errno);
            ret = false;
        }
    }
    else {
        printf("Could not read file %s, err: %d\n", source_file_name, errno);
        ret = false;
    }

    while (ret) {
        size_t nb_read = fread(line, 1, sizeof(line), F_in);

        if (nb_read > 0) {
            ret = fwrite(line, 1, nb_read, F_out) > 0;
        }
        else {
            ret = feof(F_in) != 0;
            break;
        }
    }

    if (F_in != NULL) {
        fclose(F_in);
    }

    if (F_out != NULL) {
        fclose(F_out);
    }

    return ret;
}